

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::TlsTest::readFromClient(TlsTest *this,AsyncIoStream *server)

{
  long lVar1;
  uchar *__buf;
  void *pvVar2;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_test_c__:443:24)>
  *location;
  Promise<void> readPromise;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_70;
  void *continuationTracePtr;
  anon_class_24_1_ba1d39d3_for_func checkBuffer;
  Array<unsigned_char> buf;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  __buf = kj::_::HeapArrayDisposer::allocate<unsigned_char>(4);
  buf.size_ = 4;
  buf.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  buf.ptr = __buf;
  AsyncInputStream::read((AsyncInputStream *)&readPromise,(int)server,__buf,4);
  checkBuffer.buf.size_ = 4;
  checkBuffer.buf.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  buf.ptr = (uchar *)0x0;
  buf.size_ = 0;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:443:24)>
       ::anon_class_24_1_ba1d39d3_for_func::operator();
  lVar1 = *(long *)((long)readPromise.super_PromiseBase.node.ptr + 8);
  checkBuffer.buf.ptr = __buf;
  if (lVar1 == 0 || (ulong)((long)readPromise.super_PromiseBase.node.ptr - lVar1) < 0x38) {
    pvVar2 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_test_c__:443:24)>
                *)((long)pvVar2 + 0x3c8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TlsTest::readFromClient(kj::AsyncIoStream&)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TlsTest::readFromClient(kj::AsyncIoStream&)::_lambda()_1_,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&readPromise,&checkBuffer
               ,&continuationTracePtr);
    *(void **)((long)pvVar2 + 0x3d0) = pvVar2;
  }
  else {
    *(undefined8 *)((long)readPromise.super_PromiseBase.node.ptr + 8) = 0;
    location = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_test_c__:443:24)>
                *)((long)readPromise.super_PromiseBase.node.ptr + -0x38);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TlsTest::readFromClient(kj::AsyncIoStream&)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TlsTest::readFromClient(kj::AsyncIoStream&)::_lambda()_1_,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&readPromise,&checkBuffer
               ,&continuationTracePtr);
    *(long *)((long)readPromise.super_PromiseBase.node.ptr + -0x30) = lVar1;
  }
  local_70.ptr = (PromiseNode *)0x0;
  (this->io).lowLevelProvider.disposer = (Disposer *)location;
  local_30.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
  Array<unsigned_char>::~Array(&checkBuffer.buf);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&readPromise);
  Array<unsigned_char>::~Array(&buf);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> readFromClient(AsyncIoStream& server) {
    auto buf = heapArray<byte>(4);

    auto readPromise = server.read(buf);

    auto checkBuffer = [buf = kj::mv(buf)]() {
      KJ_ASSERT(buf == "foo\x00"_kjb);
    };

    return readPromise.then(kj::mv(checkBuffer));
  }